

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_scan.cc
# Opt level: O1

Subtests * __thiscall
hwtest::pgraph::PGraphScanTests::subtests_abi_cxx11_
          (Subtests *__return_storage_ptr__,PGraphScanTests *this)

{
  mt19937 *this_00;
  TestOptions *pTVar1;
  Test *pTVar2;
  result_type rVar3;
  long lVar4;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hwtest::Test_*>_>
  __l;
  allocator_type local_261;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hwtest::Test_*>
  local_260;
  undefined4 *local_238;
  undefined8 local_230;
  undefined4 local_228;
  undefined2 local_224;
  Test *local_218;
  undefined4 *local_210;
  undefined8 local_208;
  undefined4 local_200;
  undefined3 uStack_1fc;
  undefined1 local_1f9;
  Test *local_1f0;
  undefined4 *local_1e8;
  undefined8 local_1e0;
  undefined4 local_1d8;
  undefined2 local_1d4;
  undefined1 local_1d2;
  Test *local_1c8;
  undefined4 *local_1c0;
  undefined8 local_1b8;
  undefined4 local_1b0 [4];
  Test *local_1a0;
  undefined4 *local_198;
  undefined8 local_190;
  undefined4 local_188;
  undefined1 local_184;
  Test *local_178;
  undefined4 *local_170;
  undefined8 local_168;
  undefined4 local_160;
  undefined3 uStack_15c;
  undefined1 local_159;
  Test *local_150;
  undefined4 *local_148;
  undefined8 local_140;
  undefined4 local_138;
  undefined2 local_134;
  undefined1 local_132;
  Test *local_128;
  undefined4 *local_120;
  undefined8 local_118;
  undefined4 local_110 [4];
  Test *local_100;
  undefined4 *local_f8;
  undefined8 local_f0;
  undefined4 local_e8;
  undefined1 local_e4;
  Test *local_d8;
  undefined4 *local_d0;
  undefined8 local_c8;
  undefined4 local_c0;
  undefined2 local_bc;
  Test *local_b0;
  undefined4 *local_a8;
  undefined8 local_a0;
  undefined4 local_98;
  undefined1 local_94;
  Test *local_88;
  undefined4 *local_80;
  undefined8 local_78;
  undefined4 local_70;
  undefined3 uStack_6c;
  undefined1 local_69;
  Test *local_60;
  undefined4 *local_58 [2];
  undefined4 local_48;
  undefined2 local_44;
  undefined1 local_42;
  Test *local_38;
  
  pTVar2 = (Test *)operator_new(0x13c0);
  pTVar1 = (this->super_Test).opt;
  this_00 = &(this->super_Test).rnd;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  Test::Test(pTVar2,pTVar1,(uint32_t)rVar3);
  pTVar2->_vptr_Test = (_func_int **)&PTR__Test_00346da0;
  local_260.first._M_dataplus._M_p = (pointer)&local_260.first.field_2;
  local_260.first.field_2._M_allocated_capacity._0_4_ = 0x65636361;
  local_260.first.field_2._M_allocated_capacity._4_2_ = 0x7373;
  local_260.first._M_string_length = 6;
  local_260.first.field_2._M_local_buf[6] = '\0';
  local_260.second = pTVar2;
  pTVar2 = (Test *)operator_new(0x13c8);
  pTVar1 = (this->super_Test).opt;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  Test::Test(pTVar2,pTVar1,(uint32_t)rVar3);
  *(undefined4 *)&pTVar2[1]._vptr_Test = 1;
  pTVar2->_vptr_Test = (_func_int **)&PTR__Test_00346e00;
  local_238 = &local_228;
  local_228 = 0x75626564;
  local_224 = 0x67;
  local_230 = 5;
  local_218 = pTVar2;
  pTVar2 = (Test *)operator_new(0x13c8);
  pTVar1 = (this->super_Test).opt;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  Test::Test(pTVar2,pTVar1,(uint32_t)rVar3);
  *(undefined4 *)&pTVar2[1]._vptr_Test = 1;
  pTVar2->_vptr_Test = (_func_int **)&PTR__Test_00346ec0;
  local_210 = &local_200;
  local_200 = 0x746e6f63;
  uStack_1fc = 0x6c6f72;
  local_208 = 7;
  local_1f9 = 0;
  local_1f0 = pTVar2;
  pTVar2 = (Test *)operator_new(0x13c8);
  pTVar1 = (this->super_Test).opt;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  Test::Test(pTVar2,pTVar1,(uint32_t)rVar3);
  *(undefined4 *)&pTVar2[1]._vptr_Test = 1;
  pTVar2->_vptr_Test = (_func_int **)&PTR__Test_00346f20;
  local_1e8 = &local_1d8;
  local_1d8 = 0x766e6163;
  local_1d4 = 0x7361;
  local_1e0 = 6;
  local_1d2 = 0;
  local_1c8 = pTVar2;
  pTVar2 = (Test *)operator_new(0x13c8);
  pTVar1 = (this->super_Test).opt;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  Test::Test(pTVar2,pTVar1,(uint32_t)rVar3);
  *(undefined4 *)&pTVar2[1]._vptr_Test = 1;
  pTVar2->_vptr_Test = (_func_int **)&PTR__Test_00346f80;
  local_1c0 = local_1b0;
  local_1b0[0] = 0x787476;
  local_1b8 = 3;
  local_1a0 = pTVar2;
  pTVar2 = (Test *)operator_new(0x13c8);
  pTVar1 = (this->super_Test).opt;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  Test::Test(pTVar2,pTVar1,(uint32_t)rVar3);
  *(undefined4 *)&pTVar2[1]._vptr_Test = 1;
  pTVar2->_vptr_Test = (_func_int **)&PTR__Test_00346fe0;
  local_198 = &local_188;
  local_188 = 0x70696c63;
  local_190 = 4;
  local_184 = 0;
  local_178 = pTVar2;
  pTVar2 = (Test *)operator_new(0x13c8);
  pTVar1 = (this->super_Test).opt;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  Test::Test(pTVar2,pTVar1,(uint32_t)rVar3);
  *(undefined4 *)&pTVar2[1]._vptr_Test = 1;
  pTVar2->_vptr_Test = (_func_int **)&PTR__Test_00347040;
  local_170 = &local_160;
  local_160 = 0x746e6f63;
  uStack_15c = 0x747865;
  local_168 = 7;
  local_159 = 0;
  local_150 = pTVar2;
  pTVar2 = (Test *)operator_new(0x13c8);
  pTVar1 = (this->super_Test).opt;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  Test::Test(pTVar2,pTVar1,(uint32_t)rVar3);
  *(undefined4 *)&pTVar2[1]._vptr_Test = 1;
  pTVar2->_vptr_Test = (_func_int **)&PTR__Test_003470a0;
  local_148 = &local_138;
  local_138 = 0x61747376;
  local_134 = 0x6574;
  local_140 = 6;
  local_132 = 0;
  local_128 = pTVar2;
  pTVar2 = (Test *)operator_new(0x13c8);
  pTVar1 = (this->super_Test).opt;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  Test::Test(pTVar2,pTVar1,(uint32_t)rVar3);
  *(undefined4 *)&pTVar2[1]._vptr_Test = 1;
  pTVar2->_vptr_Test = (_func_int **)&PTR__Test_00347100;
  local_120 = local_110;
  local_110[0] = 0x616d64;
  local_118 = 3;
  local_100 = pTVar2;
  pTVar2 = (Test *)operator_new(0x13c8);
  pTVar1 = (this->super_Test).opt;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  Test::Test(pTVar2,pTVar1,(uint32_t)rVar3);
  *(undefined4 *)&pTVar2[1]._vptr_Test = 1;
  pTVar2->_vptr_Test = (_func_int **)&PTR__Test_00347160;
  local_f8 = &local_e8;
  local_e8 = 0x30643364;
  local_f0 = 4;
  local_e4 = 0;
  local_d8 = pTVar2;
  pTVar2 = (Test *)operator_new(0x13c8);
  pTVar1 = (this->super_Test).opt;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  Test::Test(pTVar2,pTVar1,(uint32_t)rVar3);
  *(undefined4 *)&pTVar2[1]._vptr_Test = 1;
  pTVar2->_vptr_Test = (_func_int **)&PTR__Test_003471c0;
  local_d0 = &local_c0;
  local_c0 = 0x35643364;
  local_bc = 0x36;
  local_c8 = 5;
  local_b0 = pTVar2;
  pTVar2 = (Test *)operator_new(0x13c8);
  pTVar1 = (this->super_Test).opt;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  Test::Test(pTVar2,pTVar1,(uint32_t)rVar3);
  *(undefined4 *)&pTVar2[1]._vptr_Test = 1;
  pTVar2->_vptr_Test = (_func_int **)&PTR__Test_00347220;
  local_a8 = &local_98;
  local_98 = 0x64336566;
  local_a0 = 4;
  local_94 = 0;
  local_88 = pTVar2;
  pTVar2 = (Test *)operator_new(0x13c8);
  pTVar1 = (this->super_Test).opt;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  Test::Test(pTVar2,pTVar1,(uint32_t)rVar3);
  *(undefined4 *)&pTVar2[1]._vptr_Test = 1;
  pTVar2->_vptr_Test = (_func_int **)&PTR__Test_00347280;
  local_80 = &local_70;
  local_70 = 0x736c6563;
  uStack_6c = 0x737569;
  local_78 = 7;
  local_69 = 0;
  local_60 = pTVar2;
  pTVar2 = (Test *)operator_new(0x13c8);
  pTVar1 = (this->super_Test).opt;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  Test::Test(pTVar2,pTVar1,(uint32_t)rVar3);
  *(undefined4 *)&pTVar2[1]._vptr_Test = 1;
  pTVar2->_vptr_Test = (_func_int **)&PTR__Test_003472e0;
  local_58[0] = &local_48;
  local_48 = 0x766c656b;
  local_44 = 0x6e69;
  local_58[1] = (undefined4 *)0x6;
  local_42 = 0;
  __l._M_len = 0xe;
  __l._M_array = &local_260;
  local_38 = pTVar2;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hwtest::Test_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hwtest::Test_*>_>_>
  ::vector(__return_storage_ptr__,__l,&local_261);
  lVar4 = 0;
  do {
    if ((void *)((long)&local_48 + lVar4) != *(void **)((long)local_58 + lVar4)) {
      operator_delete(*(void **)((long)local_58 + lVar4));
    }
    lVar4 = lVar4 + -0x28;
  } while (lVar4 != -0x230);
  return __return_storage_ptr__;
}

Assistant:

Test::Subtests PGraphScanTests::subtests() {
	return {
		{"access", new ScanAccessTest(opt, rnd())},
		{"debug", new ScanDebugTest(opt, rnd())},
		{"control", new ScanControlTest(opt, rnd())},
		{"canvas", new ScanCanvasTest(opt, rnd())},
		{"vtx", new ScanVtxTest(opt, rnd())},
		{"clip", new ScanClipTest(opt, rnd())},
		{"context", new ScanContextTest(opt, rnd())},
		{"vstate", new ScanVStateTest(opt, rnd())},
		{"dma", new ScanDmaTest(opt, rnd())},
		{"d3d0", new ScanD3D0Test(opt, rnd())},
		{"d3d56", new ScanD3D56Test(opt, rnd())},
		{"fe3d", new ScanFe3dTest(opt, rnd())},
		{"celsius", new ScanCelsiusTest(opt, rnd())},
		{"kelvin", new ScanKelvinTest(opt, rnd())},
	};
}